

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipx_internal.h
# Opt level: O3

void __thiscall ipx::Parameters::Parameters(Parameters *this)

{
  (this->super_ipx_parameters).display = 1;
  (this->super_ipx_parameters).logfile = (char *)0x0;
  (this->super_ipx_parameters).analyse_basis_data = false;
  (this->super_ipx_parameters).print_interval = 5.0;
  (this->super_ipx_parameters).time_limit = -1.0;
  (this->super_ipx_parameters).dualize = -1;
  (this->super_ipx_parameters).scale = 1;
  (this->super_ipx_parameters).ipm_maxiter = 300;
  (this->super_ipx_parameters).ipm_feasibility_tol = 1e-06;
  (this->super_ipx_parameters).ipm_optimality_tol = 1e-08;
  (this->super_ipx_parameters).ipm_drop_primal = 1e-09;
  (this->super_ipx_parameters).ipm_drop_dual = 1e-09;
  (this->super_ipx_parameters).kkt_tol = 0.3;
  (this->super_ipx_parameters).crash_basis = 1;
  (this->super_ipx_parameters).dependency_tol = 1e-06;
  (this->super_ipx_parameters).volume_tol = 2.0;
  (this->super_ipx_parameters).rows_per_slice = 10000;
  (this->super_ipx_parameters).maxskip_updates = 10;
  (this->super_ipx_parameters).lu_kernel = 0;
  (this->super_ipx_parameters).lu_pivottol = 0.0625;
  (this->super_ipx_parameters).run_crossover = 1;
  (this->super_ipx_parameters).start_crossover_tol = 1e-08;
  (this->super_ipx_parameters).pfeasibility_tol = 1e-07;
  (this->super_ipx_parameters).dfeasibility_tol = 1e-07;
  (this->super_ipx_parameters).debug = 0;
  (this->super_ipx_parameters).switchiter = -1;
  (this->super_ipx_parameters).stop_at_switch = 0;
  (this->super_ipx_parameters).update_heuristic = 1;
  (this->super_ipx_parameters).maxpasses = -1;
  (this->super_ipx_parameters).run_centring = 0;
  (this->super_ipx_parameters).max_centring_steps = 5;
  (this->super_ipx_parameters).centring_ratio_tolerance = 100.0;
  (this->super_ipx_parameters).centring_ratio_reduction = 1.5;
  (this->super_ipx_parameters).centring_alpha_scaling = 0.5;
  (this->super_ipx_parameters).bad_products_tolerance = 3;
  (this->super_ipx_parameters).highs_logging = false;
  (this->super_ipx_parameters).log_options = (HighsLogOptions *)0x0;
  return;
}

Assistant:

Parameters() {
    display = 1;
    logfile = nullptr;
    print_interval = 5.0;
    analyse_basis_data = false;
    time_limit = -1.0;
    dualize = -1;
    scale = 1;
    ipm_maxiter = 300;
    ipm_feasibility_tol = 1e-6;
    ipm_optimality_tol = 1e-8;
    ipm_drop_primal = 1e-9;
    ipm_drop_dual = 1e-9;
    kkt_tol = 0.3;
    crash_basis = 1;
    dependency_tol = 1e-6;
    volume_tol = 2.0;
    rows_per_slice = 10000;
    maxskip_updates = 10;
    lu_kernel = 0;
    lu_pivottol = 0.0625;
    run_crossover = 1;
    start_crossover_tol = 1e-8;
    pfeasibility_tol = 1e-7;
    dfeasibility_tol = 1e-7;
    debug = 0;
    switchiter = -1;
    stop_at_switch = 0;
    update_heuristic = 1;
    maxpasses = -1;
    run_centring = 0;
    max_centring_steps = 5;
    centring_ratio_tolerance = 100.0;
    centring_ratio_reduction = 1.5;
    centring_alpha_scaling = 0.5;
    bad_products_tolerance = 3;
    highs_logging = false;
    log_options = nullptr;
  }